

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

int __thiscall luna::Function::AddChildFunction(Function *this,Function *child)

{
  iterator __position;
  pointer ppFVar1;
  Function *local_18;
  
  __position._M_current =
       (this->child_funcs_).super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->child_funcs_).super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = child;
    std::vector<luna::Function*,std::allocator<luna::Function*>>::
    _M_realloc_insert<luna::Function*const&>
              ((vector<luna::Function*,std::allocator<luna::Function*>> *)&this->child_funcs_,
               __position,&local_18);
    ppFVar1 = (this->child_funcs_).
              super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = child;
    ppFVar1 = (this->child_funcs_).
              super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
    (this->child_funcs_).super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  return (int)((ulong)((long)ppFVar1 -
                      (long)(this->child_funcs_).
                            super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int Function::AddChildFunction(Function *child)
    {
        child_funcs_.push_back(child);
        return child_funcs_.size() - 1;
    }